

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O0

void __thiscall
Rml::GeometryBackgroundBorder::DrawArc
          (GeometryBackgroundBorder *this,Vector2f pos_center,Vector2f r,float a0,float a1,
          ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  code *pcVar1;
  bool bVar2;
  ColourbPremultiplied CVar3;
  size_type sVar4;
  reference pvVar5;
  int iVar6;
  float x;
  float y;
  Vector2<float> local_5c;
  Vector2f local_54;
  Vector2<float> local_4c;
  Vector2f unit_vector;
  float a;
  float t;
  int i;
  int offset_vertices;
  int num_points_local;
  float a1_local;
  float a0_local;
  GeometryBackgroundBorder *this_local;
  ColourbPremultiplied color1_local;
  ColourbPremultiplied color0_local;
  Vector2f r_local;
  Vector2f pos_center_local;
  
  if ((((num_points < 2) || (color1_local = (ColourbPremultiplied)r.x, (float)color1_local <= 0.0))
      || (color0_local = (ColourbPremultiplied)r.y, (float)color0_local <= 0.0)) &&
     (bVar2 = Assert("RMLUI_ASSERT(num_points >= 2 && r.x > 0 && r.y > 0)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                     ,0xb9), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar4 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(this->vertices);
  iVar6 = (int)sVar4;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            (this->vertices,(long)(iVar6 + num_points));
  for (a = 0.0; (int)a < num_points; a = (float)((int)a + 1)) {
    unit_vector.y = (float)(int)a / (float)(num_points + -1);
    unit_vector.x = Math::Lerp<float>(unit_vector.y,a0,a1);
    x = Math::Cos(unit_vector.x);
    y = Math::Sin(unit_vector.x);
    Vector2<float>::Vector2(&local_4c,x,y);
    local_5c = Vector2<float>::operator*(&local_4c,r);
    local_54 = Vector2<float>::operator+(&local_5c,pos_center);
    pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       (this->vertices,(long)(iVar6 + (int)a));
    pvVar5->position = local_54;
    CVar3 = Math::RoundedLerp(unit_vector.y,color0,color1);
    pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       (this->vertices,(long)(iVar6 + (int)a));
    pvVar5->colour = CVar3;
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArc(Vector2f pos_center, Vector2f r, float a0, float a1, ColourbPremultiplied color0, ColourbPremultiplied color1,
	int num_points)
{
	RMLUI_ASSERT(num_points >= 2 && r.x > 0 && r.y > 0);

	const int offset_vertices = (int)vertices.size();

	vertices.resize(offset_vertices + num_points);

	for (int i = 0; i < num_points; i++)
	{
		const float t = float(i) / float(num_points - 1);

		const float a = Math::Lerp(t, a0, a1);

		const Vector2f unit_vector(Math::Cos(a), Math::Sin(a));

		vertices[offset_vertices + i].position = unit_vector * r + pos_center;
		vertices[offset_vertices + i].colour = Math::RoundedLerp(t, color0, color1);
	}
}